

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_wiener_convolve_add_src_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  uint8_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint8_t *puVar17;
  undefined1 *puVar18;
  ushort *puVar19;
  int k;
  long lVar20;
  int sum;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  uint8_t *puStack_10750;
  undefined1 auStack_10738 [16];
  undefined1 auStack_10728 [16];
  undefined1 auStack_10718 [16];
  undefined1 auStack_10708 [16];
  undefined1 auStack_106f8 [16];
  undefined1 auStack_106e8 [16];
  undefined1 auStack_106d8 [16];
  undefined1 auStack_106c8 [67224];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined2 uVar31;
  
  uVar12 = (uint)((ulong)filter_y >> 4) & 0xf;
  iVar8 = (int)((h + -1) * y_step_q4 + uVar12) >> 4;
  iVar10 = iVar8 + 7;
  lVar14 = (long)(iVar10 * 0x80);
  *(undefined1 (*) [16])(auStack_106c8 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_106d8 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_106e8 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_106f8 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_10708 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_10718 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_10728 + lVar14 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_10738 + lVar14 * 2) = (undefined1  [16])0x0;
  if (-7 < iVar8) {
    bVar11 = (byte)conv_params->round_0;
    puVar17 = src + src_stride * -3 + -3;
    uVar21 = ~(-1 << (0x10 - bVar11 & 0x1f));
    puVar18 = auStack_10738;
    iVar8 = 0;
    do {
      if (0 < w) {
        uVar15 = 0;
        uVar16 = (uint)((ulong)filter_x >> 4) & 0xf;
        do {
          iVar22 = 0;
          iVar23 = 0;
          iVar24 = 0;
          iVar25 = 0;
          lVar14 = 0;
          do {
            uVar2 = *(undefined4 *)(puVar17 + lVar14 + ((int)uVar16 >> 4));
            uVar1 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar1;
            auVar3[0xc] = (char)((uint)uVar2 >> 0x18);
            auVar4[8] = (char)((uint)uVar2 >> 0x10);
            auVar4._0_8_ = uVar1;
            auVar4[9] = 0;
            auVar4._10_3_ = auVar3._10_3_;
            auVar6._5_8_ = 0;
            auVar6._0_5_ = auVar4._8_5_;
            auVar30._0_4_ = (undefined4)uVar1;
            auVar5[4] = (char)((uint)uVar2 >> 8);
            auVar5._0_4_ = auVar30._0_4_;
            auVar5[5] = 0;
            auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
            auVar30._4_9_ = auVar5._4_9_;
            auVar30._13_3_ = 0;
            uVar1 = *(ulong *)((ulong)((uVar16 & 0xf) << 4) + ((ulong)filter_x & 0xffffffffffffff00)
                              + lVar14 * 2);
            uVar31 = (undefined2)(uVar1 >> 0x30);
            auVar29._8_4_ = 0;
            auVar29._0_8_ = uVar1;
            auVar29._12_2_ = uVar31;
            auVar29._14_2_ = uVar31;
            uVar31 = (undefined2)(uVar1 >> 0x20);
            auVar28._12_4_ = auVar29._12_4_;
            auVar28._8_2_ = 0;
            auVar28._0_8_ = uVar1;
            auVar28._10_2_ = uVar31;
            auVar27._10_6_ = auVar28._10_6_;
            auVar27._8_2_ = uVar31;
            auVar27._0_8_ = uVar1;
            uVar31 = (undefined2)(uVar1 >> 0x10);
            auVar26._8_8_ = auVar27._8_8_;
            auVar26._6_2_ = uVar31;
            auVar26._4_2_ = uVar31;
            auVar26._0_2_ = (undefined2)uVar1;
            auVar26._2_2_ = auVar26._0_2_;
            auVar30 = pmaddwd(auVar26,auVar30);
            iVar22 = iVar22 + auVar30._0_4_;
            iVar23 = iVar23 + auVar30._4_4_;
            iVar24 = iVar24 + auVar30._8_4_;
            iVar25 = iVar25 + auVar30._12_4_;
            lVar14 = lVar14 + 4;
          } while (lVar14 != 8);
          uVar9 = (int)((uint)puVar17[(long)((int)uVar16 >> 4) + 3] * 0x80 +
                        ((1 << (bVar11 & 0x1f)) >> 1) + 0x4000 + iVar25 + iVar23 + iVar24 + iVar22)
                  >> (bVar11 & 0x1f);
          uVar13 = uVar21;
          if ((int)uVar9 < (int)uVar21) {
            uVar13 = uVar9;
          }
          uVar31 = (undefined2)uVar13;
          if ((int)uVar9 < 0) {
            uVar31 = 0;
          }
          *(undefined2 *)(puVar18 + uVar15 * 2) = uVar31;
          uVar16 = uVar16 + x_step_q4;
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uint)w);
      }
      puVar17 = puVar17 + src_stride;
      puVar18 = puVar18 + 0x100;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar10);
  }
  if (0 < w) {
    bVar11 = (byte)conv_params->round_1;
    puVar18 = auStack_10738;
    iVar10 = 0;
    puStack_10750 = dst;
    do {
      if (0 < h) {
        uVar15 = 0;
        uVar21 = uVar12;
        do {
          lVar14 = (long)((int)uVar21 >> 4) * 0x100;
          puVar19 = (ushort *)(puVar18 + lVar14);
          lVar20 = 0;
          iVar8 = 0;
          do {
            iVar8 = iVar8 + (int)*(short *)((ulong)((uVar21 & 0xf) << 4) +
                                            ((ulong)filter_y & 0xffffffffffffff00) + lVar20 * 2) *
                            (uint)*puVar19;
            lVar20 = lVar20 + 1;
            puVar19 = puVar19 + 0x80;
          } while (lVar20 != 8);
          iVar8 = (int)((uint)*(ushort *)(puVar18 + lVar14 + 0x300) * 0x80 +
                        ((1 << (bVar11 & 0x1f)) >> 1) + (-1 << (bVar11 + 7 & 0x1f)) + iVar8) >>
                  (bVar11 & 0x1f);
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          uVar7 = (uint8_t)iVar8;
          if (0xfe < iVar8) {
            uVar7 = 0xff;
          }
          puStack_10750[uVar15 * dst_stride] = uVar7;
          uVar21 = uVar21 + y_step_q4;
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uint)h);
      }
      puVar18 = puVar18 + 2;
      puStack_10750 = puStack_10750 + 1;
      iVar10 = iVar10 + 1;
    } while (iVar10 != w);
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_c(const uint8_t *src, ptrdiff_t src_stride,
                                   uint8_t *dst, ptrdiff_t dst_stride,
                                   const int16_t *filter_x, int x_step_q4,
                                   const int16_t *filter_y, int y_step_q4,
                                   int w, int h,
                                   const WienerConvolveParams *conv_params) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);

  const InterpKernel *const filters_y = get_filter_base(filter_y);
  const int y0_q4 = get_filter_offset(filter_y, filters_y);

  uint16_t temp[WIENER_MAX_EXT_SIZE * MAX_SB_SIZE];
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS - 1;
  memset(temp + (intermediate_height * MAX_SB_SIZE), 0, MAX_SB_SIZE);

  assert(w <= MAX_SB_SIZE);
  assert(h <= MAX_SB_SIZE);
  assert(y_step_q4 <= 32);
  assert(x_step_q4 <= 32);

  convolve_add_src_horiz_hip(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                             src_stride, temp, MAX_SB_SIZE, filters_x, x0_q4,
                             x_step_q4, w, intermediate_height,
                             conv_params->round_0);
  convolve_add_src_vert_hip(temp + MAX_SB_SIZE * (SUBPEL_TAPS / 2 - 1),
                            MAX_SB_SIZE, dst, dst_stride, filters_y, y0_q4,
                            y_step_q4, w, h, conv_params->round_1);
}